

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Counter.cxx
# Opt level: O0

void __thiscall Fl_Counter::Fl_Counter(Fl_Counter *this,int X,int Y,int W,int H,char *L)

{
  char *L_local;
  int H_local;
  int W_local;
  int Y_local;
  int X_local;
  Fl_Counter *this_local;
  
  Fl_Valuator::Fl_Valuator(&this->super_Fl_Valuator,X,Y,W,H,L);
  (this->super_Fl_Valuator).super_Fl_Widget._vptr_Fl_Widget =
       (_func_int **)&PTR__Fl_Counter_002eb3d0;
  Fl_Widget::box((Fl_Widget *)this,FL_UP_BOX);
  Fl_Widget::selection_color((Fl_Widget *)this,8);
  Fl_Widget::align((Fl_Widget *)this,2);
  Fl_Valuator::bounds(&this->super_Fl_Valuator,-1000000.0,1000000.0);
  Fl_Valuator::step(&this->super_Fl_Valuator,1.0,10);
  this->lstep_ = 1.0;
  this->mouseobj = '\0';
  *(undefined4 *)&(this->super_Fl_Valuator).field_0xa4 = 0;
  this->textsize_ = FL_NORMAL_SIZE;
  this->textcolor_ = 0;
  return;
}

Assistant:

Fl_Counter::Fl_Counter(int X, int Y, int W, int H, const char* L)
  : Fl_Valuator(X, Y, W, H, L) {
  box(FL_UP_BOX);
  selection_color(FL_INACTIVE_COLOR); // was FL_BLUE
  align(FL_ALIGN_BOTTOM);
  bounds(-1000000.0, 1000000.0);
  Fl_Valuator::step(1, 10);
  lstep_ = 1.0;
  mouseobj = 0;
  textfont_ = FL_HELVETICA;
  textsize_ = FL_NORMAL_SIZE;
  textcolor_ = FL_FOREGROUND_COLOR;
}